

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test1_main.cpp
# Opt level: O3

int main(void)

{
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"GaussianLib Test 1",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"==================",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  commonTest1();
  affineMatrixTest1();
  affineMatrixTest2();
  quaternionTest1();
  quaternionTest2();
  matrixVectorTest1();
  complexTest1();
  projectionTest1();
  equalsTest1();
  vectorTest1();
  epsilonTest1();
  sphericalTest1();
  crossProductTest1();
  rotateVectorTest1();
  sortingTest1();
  flipTest1();
  rotateMatrixTest1();
  rcpTest1();
  stdMathTest1();
  vector3Test1();
  sseVector4Test1();
  sseVector4Test2();
  matrixInitializerTest1();
  matrixRotateTest1();
  customVectorTypeTest1();
  return 0;
}

Assistant:

int main()
{
    std::cout << "GaussianLib Test 1" << std::endl;
    std::cout << "==================" << std::endl;

    try
    {
        commonTest1();
        affineMatrixTest1();
        affineMatrixTest2();
        quaternionTest1();
        quaternionTest2();
        matrixVectorTest1();
        complexTest1();
        projectionTest1();
        equalsTest1();
        vectorTest1();
        epsilonTest1();
        sphericalTest1();
        crossProductTest1();
        rotateVectorTest1();
        sortingTest1();
        flipTest1();
        rotateMatrixTest1();
		rcpTest1();
        stdMathTest1();
        vector3Test1();
        sseVector4Test1();
        sseVector4Test2();
        matrixInitializerTest1();
        matrixRotateTest1();
        customVectorTypeTest1();
    }
    catch (const std::exception& e)
    {
        std::cerr << e.what() << std::endl;
    }

    #ifdef _WIN32
    system("pause");
    #endif

    return 0;
}